

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robot.cpp
# Opt level: O3

Joint * __thiscall
Robot::IK(Joint *__return_storage_ptr__,Robot *this,Pose *p,Joint jAct,bool bFrontBack,bool bUpDown)

{
  Brand BVar1;
  Matrix<double,_3,_1,_0,_3,_1> *pMVar2;
  int iVar3;
  double *pdVar4;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *pCVar5;
  Vector3d *pVVar6;
  long lVar7;
  char *pcVar8;
  uint uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar18;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  Pose MP;
  Matrix3d Rarm;
  Pose pJ23;
  Pose pJ1;
  Pose Rtmp;
  Pose local_278;
  Matrix3d local_238;
  double dStack_1f0;
  Matrix3d local_1e8;
  double dStack_1a0;
  Matrix3d local_198;
  Vector3d local_150;
  Pose local_138;
  Pose local_f8;
  Pose local_b8;
  Matrix3d local_78;
  
  Pose::Pose(&local_278);
  Pose::Pose(&local_b8);
  BVar1 = this->brand;
  if (BVar1 == KUKA) {
    pcVar8 = "IK KUKA\n";
    lVar7 = 8;
  }
  else {
    if (BVar1 == ABB) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"IK ABB\n",7);
      Pose::getpos(p);
      Pose::setpos(&local_278,&local_150);
      Pose::setrot(&local_b8,0.0,1.5707963267948966,0.0);
      Pose::getR(&local_1e8,p);
      Pose::getR(&local_238,&local_b8);
      pdVar4 = local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array + 2;
      lVar7 = 0;
      do {
        dVar13 = local_238.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[lVar7];
        dVar15 = local_238.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[lVar7 + 3];
        dVar24 = local_238.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[lVar7 + 6];
        ((plain_array<double,_9,_0,_0> *)(pdVar4 + -2))->array[0] =
             dVar24 * local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[6] +
             dVar15 * local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[3] +
             dVar13 * local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[0];
        pdVar4[-1] = dVar24 * local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                              .m_storage.m_data.array[7] +
                     dVar15 * local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                              .m_storage.m_data.array[4] +
                     dVar13 * local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                              .m_storage.m_data.array[1];
        *pdVar4 = dVar24 * local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                           m_storage.m_data.array[8] +
                  local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[5] * dVar15 +
                  dVar13 * local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                           m_storage.m_data.array[2];
        lVar7 = lVar7 + 1;
        pdVar4 = pdVar4 + 3;
      } while (lVar7 != 3);
      Pose::setrot(&local_278,&local_78);
      goto LAB_00104e3e;
    }
    if (BVar1 != IR) goto LAB_00104e3e;
    pcVar8 = "IK IR\n";
    lVar7 = 6;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar8,lVar7);
  local_278.pos.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [0] = (p->pos).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
        [0];
  local_278.pos.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [1] = (p->pos).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
        [1];
  local_278.pos.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [2] = (p->pos).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
        [2];
  local_278.rot.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
  [0] = (p->rot).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
        [0];
  local_278.rot.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
  [1] = (p->rot).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
        [1];
  local_278.rot.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
  [2] = (p->rot).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
        [2];
  local_278.rot.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
  [3] = (p->rot).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
        [3];
LAB_00104e3e:
  Pose::getR(&local_1e8,&local_278);
  local_238.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       (double)&local_198;
  local_238.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       0.0;
  local_238.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       4.94065645841247e-324;
  local_238.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       4.94065645841247e-324;
  local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       1.0;
  local_f8.pos.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [0] = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_238,
                      (Scalar *)&local_f8);
  local_138.pos.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [0] = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                     (pCVar5,(Scalar *)&local_138);
  if ((((pCVar5->m_currentBlockRows + pCVar5->m_row == 3) && (pCVar5->m_col == 1)) &&
      ((long)local_238.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[3] +
       (long)local_238.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[1] == 3)) &&
     (local_238.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [2] == 4.94065645841247e-324)) {
    pMVar2 = pCVar5->m_xpr;
    dVar24 = (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
             .array[0];
    dVar20 = (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
             .array[1];
    dVar18 = (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
             .array[2];
    dVar11 = local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[2] * dVar24;
    dVar10 = local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[5] * dVar20;
    dVar21 = local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[8] * dVar18;
    dVar14 = dVar18 * local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[6];
    dVar18 = dVar18 * local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[7];
    dVar15 = dVar24 * local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[0];
    dVar24 = dVar24 * local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[1];
    dVar19 = dVar20 * local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[3];
    dVar20 = dVar20 * local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[4];
    pVVar6 = Pose::getpos(&local_278);
    dVar12 = local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[2];
    dVar13 = this->a6x;
    dVar15 = local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[0] - dVar13 * (dVar19 + dVar15 + dVar14);
    dVar24 = local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[1] - dVar13 * (dVar20 + dVar24 + dVar18);
    auVar17._8_4_ = (int)-(ulong)(ABS(dVar24) < 0.001);
    auVar17._0_8_ = -(ulong)(ABS(dVar15) < 0.001);
    auVar17._12_4_ = (int)(-(ulong)(ABS(dVar24) < 0.001) >> 0x20);
    iVar3 = movmskpd((int)pVVar6,auVar17);
    if (iVar3 == 3) {
      dVar20 = Joint::getj1(&jAct);
    }
    else {
      dVar20 = atan2(dVar24,dVar15);
      if (bFrontBack) {
        if (dVar20 <= 0.0) {
          dVar20 = dVar20 + 3.141592653589793;
        }
        else {
          dVar20 = dVar20 + -3.141592653589793;
        }
      }
    }
    uVar9 = (uint)((ulong)this->a2x >> 0x20);
    if (!bFrontBack) {
      uVar9 = uVar9 ^ 0x80000000;
    }
    dVar18 = ((dVar12 - (dVar21 + dVar10 + dVar11) * dVar13) - this->a1z) - this->a2z;
    dVar11 = this->a4x + this->a5x;
    dVar13 = SQRT(dVar24 * dVar24 + dVar15 * dVar15) + (double)CONCAT44(uVar9,SUB84(this->a2x,0));
    auVar16._0_8_ = dVar18 * dVar18 + dVar13 * dVar13;
    auVar16._8_8_ = dVar11 * dVar11 + this->a4z * this->a4z;
    auVar17 = sqrtpd(auVar16,auVar16);
    dVar24 = auVar17._8_8_;
    dVar15 = auVar17._0_8_;
    if (this->a3z + dVar24 <= dVar15) {
      pcVar8 = "Error: impossible to reach that point";
      lVar7 = 0x25;
    }
    else {
      if (ABS(this->a3z - dVar24) < dVar15) {
        dVar11 = atan2(dVar18,dVar13);
        dVar13 = this->a3z;
        dVar18 = ((dVar13 * dVar13 + dVar15 * dVar15) - dVar24 * dVar24) /
                 ((dVar15 + dVar15) * dVar13);
        dVar13 = 1.0 - dVar18 * dVar18;
        if (dVar13 < 0.0) {
          dVar13 = sqrt(dVar13);
        }
        else {
          dVar13 = SQRT(dVar13);
        }
        dVar13 = atan2(dVar13,dVar18);
        uVar9 = (uint)((ulong)dVar13 >> 0x20);
        if (!bUpDown) {
          uVar9 = uVar9 ^ 0x80000000;
        }
        dVar11 = (1.5707963267948966 - dVar11) + (double)CONCAT44(uVar9,SUB84(dVar13,0));
        dVar13 = this->a3z;
        dVar15 = ((dVar24 * dVar24 + dVar13 * dVar13) - dVar15 * dVar15) /
                 (dVar24 * (dVar13 + dVar13));
        dVar13 = 1.0 - dVar15 * dVar15;
        if (dVar13 < 0.0) {
          dVar13 = sqrt(dVar13);
        }
        else {
          dVar13 = SQRT(dVar13);
        }
        dVar13 = atan2(dVar13,dVar15);
        dVar15 = atan2(this->a4x + this->a5x,this->a4z);
        dVar15 = (3.141592653589793 - dVar13) - dVar15;
        Pose::Pose(&local_f8);
        Pose::Pose(&local_138);
        Pose::setrot(&local_f8,0.0,0.0,dVar20);
        Pose::setrot(&local_138,0.0,dVar11 + dVar15,0.0);
        Pose::getR(&local_238,&local_f8);
        Pose::getR(&local_198,&local_138);
        lVar7 = 0x10;
        do {
          dVar13 = *(double *)
                    ((long)local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                           m_storage.m_data.array + lVar7);
          dVar24 = *(double *)
                    ((long)local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                           m_storage.m_data.array + lVar7 + 0x40);
          dVar18 = *(double *)((long)&dStack_1a0 + lVar7);
          *(double *)
           ((long)local_238.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array + lVar7 + 0x40) =
               dVar18 * local_238.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                        m_storage.m_data.array[3] +
               dVar24 * local_238.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                        m_storage.m_data.array[0] +
               dVar13 * local_238.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                        m_storage.m_data.array[6];
          *(double *)((long)&dStack_1f0 + lVar7) =
               dVar18 * local_238.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                        m_storage.m_data.array[4] +
               dVar24 * local_238.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                        m_storage.m_data.array[1] +
               dVar13 * local_238.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                        m_storage.m_data.array[7];
          *(double *)
           ((long)local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array + lVar7) =
               dVar18 * local_238.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                        m_storage.m_data.array[5] +
               dVar13 * local_238.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                        m_storage.m_data.array[8] +
               dVar24 * local_238.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                        m_storage.m_data.array[2];
          lVar7 = lVar7 + 0x18;
        } while (lVar7 != 0x58);
        Pose::getR(&local_238,&local_278);
        dVar13 = local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[2] *
                 local_238.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[2] +
                 local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[1] *
                 local_238.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[1] +
                 local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[0] *
                 local_238.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[0];
        dVar24 = local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[8] *
                 local_238.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[5] +
                 local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[7] *
                 local_238.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[4] +
                 local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[6] *
                 local_238.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[3];
        dVar18 = local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[8] *
                 local_238.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[8] +
                 local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[7] *
                 local_238.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[7] +
                 local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[6] *
                 local_238.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[6];
        if (0.9999999 <= dVar13) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Rwrist11 = +1",0xd);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
          std::ostream::put(-0x68);
          std::ostream::flush();
          dVar13 = Joint::getj4(&jAct);
          dVar24 = atan2(dVar24,dVar18);
          dVar24 = dVar24 - dVar13;
          dVar18 = 0.0;
        }
        else if (dVar13 <= -0.9999999) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Rwrist11 = -1",0xd);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
          std::ostream::put(-0x68);
          std::ostream::flush();
          dVar13 = Joint::getj4(&jAct);
          dVar24 = atan2(dVar24,dVar18);
          dVar24 = dVar24 + dVar13;
          dVar18 = 3.141592653589793;
        }
        else {
          dVar19 = local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[3] *
                   local_238.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[0];
          dVar22 = local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[4] *
                   local_238.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[1];
          dVar21 = local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[5] *
                   local_238.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[2];
          dVar10 = local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[6] *
                   local_238.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[0];
          dVar14 = local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[7] *
                   local_238.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[1];
          dVar23 = local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[8] *
                   local_238.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[2];
          dVar12 = local_238.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[3] *
                   local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[0];
          dVar24 = 1.0 - dVar13 * dVar13;
          if (dVar24 < 0.0) {
            dVar24 = sqrt(dVar24);
          }
          else {
            dVar24 = SQRT(dVar24);
          }
          dVar18 = atan2(dVar24,dVar13);
          dVar13 = atan2(dVar21 + dVar22 + dVar19,-(dVar23 + dVar14 + dVar10));
          dVar24 = atan2(local_238.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[5] *
                         local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[2] +
                         local_238.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[4] *
                         local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[1] + dVar12,
                         local_238.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[8] *
                         local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[2] +
                         local_238.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[7] *
                         local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[1] +
                         local_238.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[6] *
                         local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[0]);
        }
        Joint::Joint(__return_storage_ptr__,dVar20,dVar11,dVar15,dVar13,dVar18,dVar24);
        return __return_storage_ptr__;
      }
      pcVar8 = "Error: J2 too small";
      lVar7 = 0x13;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar8,lVar7);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    __return_storage_ptr__->j1 = jAct.j1;
    __return_storage_ptr__->j2 = jAct.j2;
    __return_storage_ptr__->j3 = jAct.j3;
    __return_storage_ptr__->j4 = jAct.j4;
    __return_storage_ptr__->j5 = jAct.j5;
    __return_storage_ptr__->j6 = jAct.j6;
    return __return_storage_ptr__;
  }
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 3, 1>>::finished() [MatrixType = Eigen::Matrix<double, 3, 1>]"
               );
}

Assistant:

Joint Robot::IK(Pose p, Joint jAct, bool bFrontBack, bool bUpDown){
    double J1, J2, J3, J4, J5, J6;
    double Rwrist11, Rwrist21, Rwrist31, Rwrist12, Rwrist13, Rwrist32, Rwrist33;
    double WPxy, l, h;
    double rho, b4x;
    double alpha, beta, gamma, delta;
    double cos_beta, sin_beta;
    Vector3d x_hat, WP;
    //Pose of the mounting point (center of the axe 6)
    Pose MP;
    Pose Rtmp;

    switch(this->brand)
    {
        case IR:
            std::cout << "IK IR\n";
            MP = p;
            break;
        case ABB:
            std::cout << "IK ABB\n";
            // Mounting point MP (Center of the flange of axis 6)      
            MP.setpos(p.getpos());
            // Rotation 90° around Y
            Rtmp.setrot(0.0, M_PI/2.0, 0.0);
            MP.setrot(p.getR() * Rtmp.getR().transpose());
            break;
        case KUKA:
            std::cout << "IK KUKA\n";
            MP = p;
            break;
    }

    x_hat = MP.getR() * ((Vector3d() << 1, 0, 0).finished());
    WP = MP.getpos() - (this->a6x * x_hat);

    // Find J1
    // Check if there is a shoulder singularity
    if((abs(WP(0)) < 0.001) && (abs(WP(1)) < 0.001)){
        // In this case we have a shoulder singularity.
        // Fix J1 as the actual value of J1
        J1 = jAct.getj1();
    }
    else{
        // FRONT solution
        J1 = atan2(WP(1), WP(0));
        // To have the BACK solution I need to add or substract pi
        if(bFrontBack){
            // BACK solution is selected
            if(J1 > 0)
                J1 -= M_PI;
            else
                J1 += M_PI;
        }
    }

    // Find J2 and J3
    WPxy = sqrt( pow(WP(0),2) + pow(WP(1),2) );
    //std::cout << "WPxy:\n" << WPxy << std::endl;

    if(bFrontBack){
        // BACK solution
        l = WPxy + this->a2x;
    }
    else{
        // FRONT solution
        l = WPxy - this->a2x;
    }
    //std::cout << "l:\n" << l << std::endl;
    h = WP(2) - this->a1z - this->a2z;
    //std::cout << "h:\n" << h << std::endl;

    rho = sqrt( pow(h,2) + pow(l,2) );
    //std::cout << "rho:\n" << rho << std::endl;
    b4x = sqrt( pow(this->a4z,2) + pow(this->a4x+this->a5x,2) );
    //std::cout << "b4x:\n" << b4x << std::endl;
    if(rho >= (this->a3z+b4x)){
        // It is not possible to reach that point
        std::cout << "Error: impossible to reach that point" << std::endl;
        return jAct;
    }
    if(rho <= abs(a3z-b4x)){
        // J2 too close to the robot himself
        std::cout << "Error: J2 too small" << std::endl;
        return jAct;
    }

    alpha = atan2(h, l);
    cos_beta = (pow(rho,2) + pow(a3z,2) - pow(b4x,2)) / (2*rho*a3z);
    sin_beta = sqrt(1 - pow(cos_beta,2));
    beta = atan2(sin_beta, cos_beta);

    if(bUpDown){
        // DOWN solution
        J2 = M_PI_2 - alpha + beta;
    }     
    else{
        // UP solution
        J2 = M_PI_2 - alpha - beta;
    }

    double cos_gamma, sin_gamma;
    cos_gamma = (pow(a3z,2) + pow(b4x,2) - pow(rho,2)) / (2*a3z*b4x);
    sin_gamma = sqrt(1 - pow(cos_gamma,2));
    gamma = atan2(sin_gamma, cos_gamma);

    delta = atan2(this->a4x+this->a5x, this->a4z);

    J3 = M_PI - gamma - delta;

    //std::cout << "J1:\n" << J1 << std::endl;
    //std::cout << "J2:\n" << J2 << std::endl;
    //std::cout << "J3:\n" << J3 << std::endl;

    Pose pJ1, pJ23;
    pJ1.setrot(0.0, 0.0, J1);
    pJ23.setrot(0.0, (J2+J3), 0.0);
    //Matrix3d Rarm = RaroundZ(J1) * RaroundY(J2+J3);
    Matrix3d Rarm = pJ1.getR() * pJ23.getR();
    Matrix3d Rwrist = Rarm.transpose() * MP.getR();

    //Find J4, J5, J6

    Rwrist11 = Rwrist(0,0);
    Rwrist21 = Rwrist(1,0);
    Rwrist31 = Rwrist(2,0);
    Rwrist12 = Rwrist(0,1);
    Rwrist13 = Rwrist(0,2);
    Rwrist32 = Rwrist(2,1);
    Rwrist33 = Rwrist(2,2);

    if (Rwrist11 < 0.9999999) {
        if (Rwrist11 > -0.9999999) {
            //J5 = acos(Rwrist11);
            J5 = atan2( sqrt(1-pow(Rwrist11,2)) , Rwrist11 );
            J4 = atan2(Rwrist21,-Rwrist31);
            J6 = atan2(Rwrist12,Rwrist13);
        }
        else // Rwrist11 = −1 
        {
            std::cout << "Rwrist11 = -1" << std::endl;
            // Wrist singularity. J5 = 180 -> This condition is not
            // possible because the spherical wrist cannot rotate J5 = 180.
            // Not a unique solution: J6 − J4 = atan2(Rwrist32,Rwrist33)
            J5 = M_PI;
            J4 = jAct.getj4();
            J6 = atan2(Rwrist32,Rwrist33) + J4;
        }
    }
    else // Rwrist11 = +1
    {
        std::cout << "Rwrist11 = +1" << std::endl;
        // Wrist singularity. J5 = 0
        // Not a unique solution: J4 + J6 = atan2(Rwrist32,Rwrist33)
        J5 = 0;
        J4 = jAct.getj4();
        J6 = atan2(Rwrist32,Rwrist33) - J4;
    }

    Joint j(J1, J2, J3, J4, J5, J6);
    return j;
}